

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O0

int free_fields(size_t n_fields,char ***fields)

{
  char **__ptr;
  char **work;
  size_t ind;
  char ***fields_local;
  size_t n_fields_local;
  
  if (((n_fields == 0) || (fields == (char ***)0x0)) || (*fields == (char **)0x0)) {
    n_fields_local._4_4_ = 1;
  }
  else {
    __ptr = *fields;
    for (work = (char **)0x0; work < n_fields; work = (char **)((long)work + 1)) {
      if (__ptr[(long)work] != (char *)0x0) {
        free(__ptr[(long)work]);
      }
    }
    free(__ptr);
    n_fields_local._4_4_ = 0;
  }
  return n_fields_local._4_4_;
}

Assistant:

int 
free_fields(size_t n_fields, char*** fields) 
{
	size_t ind;
	char** work;
	
	if ((n_fields == 0) || (! fields) || (! *fields)) {
		return 1;
	}
	
	work = *fields;
	
	for (ind = 0; ind < n_fields; ind++) {
		if (! work[ind]) {
			continue;
		}
		free(work[ind]);
	}
	
	free(work);
	
	return 0;
}